

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

Node * mainposition(Table *t,TValue *key)

{
  Node *pNVar1;
  uint uVar2;
  undefined8 in_RAX;
  ulong uVar3;
  double dVar4;
  int i;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  uVar2 = key->tt_ & 0x3f;
  pNVar1 = t->node;
  if (uVar2 < 0x13) {
    switch(uVar2) {
    case 1:
switchD_001200c5_caseD_1:
      uVar3 = (ulong)(uint)(~(-1 << (t->lsizenode & 0x1f)) & (key->value_).b);
      break;
    default:
      goto switchD_001200c5_caseD_2;
    case 3:
      dVar4 = frexp((key->value_).n,&local_14);
      dVar4 = dVar4 * 2147483648.0;
      uVar2 = 0;
      if ((-9.223372036854776e+18 <= dVar4) && (uVar2 = 0, dVar4 < 9.223372036854776e+18)) {
        uVar2 = (int)(long)dVar4 + local_14;
        uVar2 = (int)uVar2 >> 0x1f ^ uVar2;
      }
      uVar3 = (ulong)((int)uVar2 % (int)(~(-1 << (t->lsizenode & 0x1f)) | 1U));
      break;
    case 4:
      uVar3 = (ulong)(~(-1 << (t->lsizenode & 0x1f)) & *(uint *)((key->value_).f + 0xc));
    }
  }
  else {
    if (uVar2 != 0x16) {
      if (uVar2 == 0x14) {
        uVar2 = luaS_hashlongstr((TString *)(key->value_).gc);
        uVar3 = (ulong)(~(-1 << (t->lsizenode & 0x1f)) & uVar2);
        goto LAB_00120183;
      }
      if (uVar2 == 0x13) goto switchD_001200c5_caseD_1;
    }
switchD_001200c5_caseD_2:
    uVar3 = (ulong)(uint)(key->value_).b % (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
  }
LAB_00120183:
  return pNVar1 + uVar3;
}

Assistant:

static Node *mainposition (const Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TNUMINT:
      return hashint(t, ivalue(key));
    case LUA_TNUMFLT:
      return hashmod(t, l_hashfloat(fltvalue(key)));
    case LUA_TSHRSTR:
      return hashstr(t, tsvalue(key));
    case LUA_TLNGSTR:
      return hashpow2(t, luaS_hashlongstr(tsvalue(key)));
    case LUA_TBOOLEAN:
      return hashboolean(t, bvalue(key));
    case LUA_TLIGHTUSERDATA:
      return hashpointer(t, pvalue(key));
    case LUA_TLCF:
      return hashpointer(t, fvalue(key));
    default:
      lua_assert(!ttisdeadkey(key));
      return hashpointer(t, gcvalue(key));
  }
}